

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall
SerialExecutionQueue::addJob(SerialExecutionQueue *this,QueueJob *job,QueueJobPriority param_2)

{
  SerialQueueImpl *this_00;
  JobDescriptor *pJVar1;
  _Manager_type p_Var2;
  uint64_t uVar3;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this_00 = this->queue;
  uVar3 = this->jobCount + 1;
  this->jobCount = uVar3;
  pJVar1 = job->desc;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  p_Var2 = (job->work).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_58,(_Any_data *)&job->work,__clone_functor);
    p_Stack_40 = (job->work)._M_invoker;
    local_48 = (job->work).super__Function_base._M_manager;
  }
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x30);
  *(uint64_t *)local_38._M_unused._0_8_ = uVar3;
  *(JobDescriptor **)((long)local_38._M_unused._0_8_ + 8) = pJVar1;
  *(uint64_t *)((long)local_38._M_unused._0_8_ + 0x10) = 0;
  *(uint64_t *)((long)local_38._M_unused._0_8_ + 0x18) = 0;
  *(uint64_t *)((long)local_38._M_unused._0_8_ + 0x20) = 0;
  *(_Invoker_type *)((long)local_38._M_unused._0_8_ + 0x28) = p_Stack_40;
  if (local_48 != (_Manager_type)0x0) {
    *(void **)((long)local_38._M_unused._0_8_ + 0x10) = local_58._M_unused._M_object;
    *(undefined8 *)((long)local_38._M_unused._0_8_ + 0x18) = local_58._8_8_;
    *(_Manager_type *)((long)local_38._M_unused._0_8_ + 0x20) = local_48;
    local_48 = (_Manager_type)0x0;
    p_Stack_40 = (_Invoker_type)0x0;
  }
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:232:18)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:232:18)>
             ::_M_manager;
  anon_unknown.dwarf_144ada::SerialQueueImpl::async(this_00,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority) override {
    uint64_t jobID = ++jobCount;
    queue->async([jobID, job]() mutable {
      SerialContext ctx(jobID, job);
      job.execute(&ctx);
    });
  }